

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

Split * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::findFallback(Split *__return_storage_ptr__,
              BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
              *this,SetMB *set)

{
  BBox1f BVar1;
  ulong uVar2;
  ulong uVar3;
  PrimRefMB *pPVar4;
  float fVar5;
  long lVar6;
  BBox1f *pBVar7;
  uint uVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001484 [12];
  
  uVar2 = (set->super_PrimInfoMB).object_range._begin;
  uVar3 = (set->super_PrimInfoMB).object_range._end;
  if (uVar3 == uVar2) {
LAB_0131b7d6:
    uVar8 = 1;
    fVar11 = 0.0;
    lVar6 = uVar3 - uVar2;
    if ((uVar3 < uVar2 || lVar6 == 0) || ((this->cfg).singleLeafTimeSegment == false))
    goto LAB_0131b901;
    pBVar7 = &set->prims->items[uVar2].time_range;
    do {
      BVar1 = *pBVar7;
      auVar12._8_8_ = 0;
      auVar12._0_4_ = BVar1.lower;
      auVar12._4_4_ = BVar1.upper;
      auVar12 = vmovshdup_avx(auVar12);
      auVar13._0_4_ = (float)(uint)pBVar7[-1].upper;
      auVar13._4_12_ = in_register_00001484;
      fVar11 = BVar1.lower;
      fVar5 = auVar12._0_4_ - fVar11;
      auVar12 = ZEXT416((uint)((((set->super_PrimInfoMB).time_range.lower - fVar11) / fVar5) *
                               1.0000002 * auVar13._0_4_));
      auVar12 = vroundss_avx(auVar12,auVar12,9);
      auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,auVar12);
      auVar14 = ZEXT416((uint)((((set->super_PrimInfoMB).time_range.upper - fVar11) / fVar5) *
                               0.99999976 * auVar13._0_4_));
      auVar14 = vroundss_avx(auVar14,auVar14,10);
      auVar14 = vminss_avx(auVar14,auVar13);
      if (1 < (int)auVar14._0_4_ - (int)auVar12._0_4_) {
        fVar11 = fVar11 + (fVar5 * (float)(((int)auVar14._0_4_ + (int)auVar12._0_4_) / 2)) /
                          auVar13._0_4_;
        uVar8 = 2;
        goto LAB_0131b901;
      }
      pBVar7 = pBVar7 + 10;
      lVar6 = lVar6 + -1;
      uVar8 = 1;
    } while (lVar6 != 0);
  }
  else {
    pPVar4 = set->prims->items;
    pfVar9 = pPVar4[uVar2 + 1].lbounds.bounds0.lower.field_0.m128 + 3;
    uVar10 = uVar2;
    do {
      uVar10 = uVar10 + 1;
      if (uVar3 <= uVar10) goto LAB_0131b7d6;
      fVar11 = *pfVar9;
      pfVar9 = pfVar9 + 0x14;
    } while (fVar11 == pPVar4[uVar2].lbounds.bounds0.lower.field_0.m128[3]);
    uVar8 = 3;
  }
  fVar11 = 0.0;
LAB_0131b901:
  __return_storage_ptr__->sah = 0.0;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = (int)fVar11;
  __return_storage_ptr__->data = uVar8;
  return __return_storage_ptr__;
}

Assistant:

__noinline Split findFallback(const SetMB& set)
          {
            /* split if primitives are not from same geometry */
            if (!sameGeometry(set))
              return Split(0.0f,Split::SPLIT_GEOMID);
            
            /* if a leaf can only hold a single time-segment, we might have to do additional temporal splits */
            if (cfg.singleLeafTimeSegment)
            {
              /* test if one primitive has more than one time segment in time range, if so split time */
              for (size_t i=set.begin(); i<set.end(); i++)
              {
                const PrimRefMB& prim = (*set.prims)[i];
                const range<int> itime_range = prim.timeSegmentRange(set.time_range);
                const int localTimeSegments = itime_range.size();
                assert(localTimeSegments > 0);
                if (localTimeSegments > 1) {
                  const int icenter = (itime_range.begin() + itime_range.end())/2;
                  const float splitTime = prim.timeStep(icenter);
                  return Split(0.0f,(unsigned)Split::SPLIT_TEMPORAL,0,splitTime);
                }
              }
            }        

            /* otherwise return fallback split */
            return Split(0.0f,Split::SPLIT_FALLBACK);
          }